

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

bool __thiscall
ON_PostEffects::AddPostEffect
          (ON_PostEffects *this,Types type,ON_UUID *id,wchar_t *param_3,ON_PostEffectParams *params,
          bool is_listable,bool listable_on,bool listable_shown)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ON_PostEffect *this_00;
  long *plVar3;
  ON_XMLNode *pOVar4;
  undefined4 extraout_var_01;
  ON_XMLNode *src;
  ON_UUID id_00;
  ON_XMLNode *pep_param_node;
  ON_wString local_520;
  ON_XMLProperty local_518;
  ON_XMLVariant local_4b0;
  ON_wString local_3b8;
  ON_XMLProperty local_3b0;
  uchar local_348 [8];
  undefined8 uStack_340;
  ON_wString local_338;
  ON_XMLVariant local_330;
  ON_wString local_238;
  ON_XMLProperty local_230;
  ON_XMLVariant local_1c8;
  ON_wString local_d0;
  ON_XMLProperty local_c8;
  long *local_60;
  ON_XMLNode *pep_node;
  ON_PostEffect *local_48;
  ON_PostEffect *pep;
  bool listable_shown_local;
  bool listable_on_local;
  ON_PostEffectParams *pOStack_38;
  bool is_listable_local;
  ON_PostEffectParams *params_local;
  wchar_t *local_name_local;
  ON_UUID *id_local;
  ON_PostEffects *pOStack_18;
  Types type_local;
  ON_PostEffects *this_local;
  undefined4 extraout_var_00;
  
  pep._6_1_ = listable_on;
  pep._5_1_ = listable_shown;
  if (type == Unset) {
    this_local._7_1_ = false;
  }
  else {
    pep._7_1_ = is_listable;
    pOStack_38 = params;
    params_local = (ON_PostEffectParams *)param_3;
    local_name_local = (wchar_t *)id;
    id_local._4_4_ = type;
    pOStack_18 = this;
    bVar1 = ::operator==(&ON_nil_uuid,id);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else if ((params_local == (ON_PostEffectParams *)0x0) ||
            (*(int *)&params_local->_vptr_ON_PostEffectParams == 0)) {
      this_local._7_1_ = false;
    }
    else {
      iVar2 = (*this->_vptr_ON_PostEffects[5])(this,local_name_local);
      ON_REMOVE_ASAP_AssertEx
                ((uint)(CONCAT44(extraout_var,iVar2) == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_post_effects.cpp"
                 ,0x2c7,"","nullptr == PostEffectFromId(id) is false");
      this_00 = (ON_PostEffect *)operator_new(0x10);
      ON_PostEffect::ON_PostEffect
                (this_00,this,id_local._4_4_,(ON_UUID *)local_name_local,(wchar_t *)params_local);
      local_48 = this_00;
      ON_SimpleArray<ON_PostEffect_*>::Append(&this->_impl->_peps,&local_48);
      iVar2 = (*local_48->_vptr_ON_PostEffect[0x10])();
      plVar3 = (long *)CONCAT44(extraout_var_00,iVar2);
      local_60 = plVar3;
      ON_wString::ON_wString(&local_d0,L"name");
      ::ON_XMLVariant::ON_XMLVariant(&local_1c8,(wchar_t *)params_local);
      ON_XMLProperty::ON_XMLProperty(&local_c8,&local_d0,&local_1c8);
      (**(code **)(*plVar3 + 0x68))(plVar3,&local_c8);
      ON_XMLProperty::~ON_XMLProperty(&local_c8);
      ::ON_XMLVariant::~ON_XMLVariant(&local_1c8);
      ON_wString::~ON_wString(&local_d0);
      plVar3 = local_60;
      ON_wString::ON_wString(&local_238,L"id");
      local_348 = *(uchar (*) [8])local_name_local;
      uStack_340 = *(undefined8 *)(local_name_local + 2);
      id_00.Data4[0] = local_348[0];
      id_00.Data4[1] = local_348[1];
      id_00.Data4[2] = local_348[2];
      id_00.Data4[3] = local_348[3];
      id_00.Data4[4] = local_348[4];
      id_00.Data4[5] = local_348[5];
      id_00.Data4[6] = local_348[6];
      id_00.Data4[7] = local_348[7];
      id_00._0_8_ = &local_338;
      ON_IdToString(id_00);
      ::ON_XMLVariant::ON_XMLVariant(&local_330,&local_338);
      ON_XMLProperty::ON_XMLProperty(&local_230,&local_238,&local_330);
      (**(code **)(*plVar3 + 0x68))(plVar3,&local_230);
      ON_XMLProperty::~ON_XMLProperty(&local_230);
      ::ON_XMLVariant::~ON_XMLVariant(&local_330);
      ON_wString::~ON_wString(&local_338);
      ON_wString::~ON_wString(&local_238);
      plVar3 = local_60;
      if ((pep._7_1_ & 1) != 0) {
        ON_wString::ON_wString(&local_3b8,L"on");
        ::ON_XMLVariant::ON_XMLVariant(&local_4b0,(bool)(pep._6_1_ & 1));
        ON_XMLProperty::ON_XMLProperty(&local_3b0,&local_3b8,&local_4b0);
        (**(code **)(*plVar3 + 0x68))(plVar3,&local_3b0);
        ON_XMLProperty::~ON_XMLProperty(&local_3b0);
        ::ON_XMLVariant::~ON_XMLVariant(&local_4b0);
        ON_wString::~ON_wString(&local_3b8);
        plVar3 = local_60;
        ON_wString::ON_wString(&local_520,L"shown");
        ::ON_XMLVariant::ON_XMLVariant((ON_XMLVariant *)&pep_param_node,(bool)(pep._5_1_ & 1));
        ON_XMLProperty::ON_XMLProperty(&local_518,&local_520,(ON_XMLVariant *)&pep_param_node);
        (**(code **)(*plVar3 + 0x68))(plVar3,&local_518);
        ON_XMLProperty::~ON_XMLProperty(&local_518);
        ::ON_XMLVariant::~ON_XMLVariant((ON_XMLVariant *)&pep_param_node);
        ON_wString::~ON_wString(&local_520);
      }
      plVar3 = local_60;
      pOVar4 = (ON_XMLNode *)operator_new(0xe8);
      ON_XMLNode::ON_XMLNode(pOVar4,L"");
      pOVar4 = (ON_XMLNode *)(**(code **)(*plVar3 + 0x58))(plVar3,pOVar4);
      if (pOVar4 != (ON_XMLNode *)0x0) {
        iVar2 = (*pOStack_38->_vptr_ON_PostEffectParams[4])();
        src = ON_XMLParameters::Node((ON_XMLParameters *)CONCAT44(extraout_var_01,iVar2));
        ON_XMLNode::operator=(pOVar4,src);
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PostEffects::AddPostEffect(ON_PostEffect::Types type, const ON_UUID& id,
                                   const wchar_t* local_name, const ON_PostEffectParams& params,
                                   bool is_listable, bool listable_on, bool listable_shown)
{
  if (ON_PostEffect::Types::Unset == type)
    return false;

  if (ON_nil_uuid == id)
    return false;

  if ((nullptr == local_name) || (0 == *local_name))
    return false;

  ON_ASSERT(nullptr == PostEffectFromId(id)); // Can't add the same id again.

  auto* pep = new ON_PostEffect(*this, type, id, local_name);
  _impl->_peps.Append(pep); // Critical.

  auto& pep_node = pep->XMLNode();

  // Write the localized name to the XML. This seems wrong at first because one would think we
  // should be writing the English name, but this is not relied on programmatically.
  // It's only written to make the XML text human-readable (assuming you can read that language).
  pep_node.SetProperty(ON_XMLProperty(ON_RDK_PEP_LOCAL_NAME, local_name));

  // Write the id to the XML.
  pep_node.SetProperty(ON_XMLProperty(ON_RDK_PEP_ID, ON_IdToString(id)));

  if (is_listable)
  {
    // Write the listable properties to the XML.
    pep_node.SetProperty(ON_XMLProperty(ON_RDK_PEP_ON, listable_on));
    pep_node.SetProperty(ON_XMLProperty(ON_RDK_PEP_SHOWN, listable_shown));
  }

  // Add the params to the XML.
  ON_XMLNode* pep_param_node = pep_node.AttachChildNode(new ON_XMLNode(L""));
  if (nullptr != pep_param_node)
  {
    *pep_param_node = params.AsXMLParameters().Node();
  }

  return true;
}